

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O2

void DrawTriangleStrip(Vector2 *points,int pointsCount,Color color)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if (2 < pointsCount) {
    rlCheckRenderBatchLimit(pointsCount * 3 + -6);
    rlBegin(4);
    rlColor4ub(color.r,color.g,color.b,color.a);
    for (uVar3 = 2; (uint)pointsCount != uVar3; uVar3 = uVar3 + 1) {
      rlVertex2f(points[uVar3].x,points[uVar3].y);
      uVar1 = (ulong)(uint)((int)uVar3 * 8);
      uVar2 = (ulong)((uVar3 & 1) == 0) << 3;
      rlVertex2f(*(float *)((long)&points[uVar3].x + (uVar1 | 0xfffffffffffffff0)),
                 *(float *)((long)&points[uVar3].x + (uVar1 | 0xfffffffffffffff4)));
      rlVertex2f(*(float *)((long)&points[uVar3].x + (uVar2 | 0xfffffffffffffff0)),
                 *(float *)((long)&points[uVar3].x + (uVar2 | 0xfffffffffffffff4)));
    }
    rlEnd();
    return;
  }
  return;
}

Assistant:

void DrawTriangleStrip(Vector2 *points, int pointsCount, Color color)
{
    if (pointsCount >= 3)
    {
        rlCheckRenderBatchLimit(3*(pointsCount - 2));

        rlBegin(RL_TRIANGLES);
            rlColor4ub(color.r, color.g, color.b, color.a);

            for (int i = 2; i < pointsCount; i++)
            {
                if ((i%2) == 0)
                {
                    rlVertex2f(points[i].x, points[i].y);
                    rlVertex2f(points[i - 2].x, points[i - 2].y);
                    rlVertex2f(points[i - 1].x, points[i - 1].y);
                }
                else
                {
                    rlVertex2f(points[i].x, points[i].y);
                    rlVertex2f(points[i - 1].x, points[i - 1].y);
                    rlVertex2f(points[i - 2].x, points[i - 2].y);
                }
            }
        rlEnd();
    }
}